

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O0

void initialize_states(void)

{
  Yshort *pYVar1;
  core *pcVar2;
  core *p;
  Yshort *start_derives;
  int i;
  
  pYVar1 = derives[start_symbol];
  for (start_derives._4_4_ = 0; -1 < pYVar1[start_derives._4_4_];
      start_derives._4_4_ = start_derives._4_4_ + 1) {
  }
  pcVar2 = (core *)malloc((ulong)(start_derives._4_4_ * 4 + 0x20));
  if (pcVar2 == (core *)0x0) {
    no_space();
  }
  pcVar2->next = (core *)0x0;
  pcVar2->link = (core *)0x0;
  pcVar2->number = 0;
  pcVar2->accessing_symbol = 0;
  pcVar2->nitems = start_derives._4_4_;
  for (start_derives._4_4_ = 0; -1 < pYVar1[start_derives._4_4_];
      start_derives._4_4_ = start_derives._4_4_ + 1) {
    pcVar2->items[start_derives._4_4_] = rrhs[pYVar1[start_derives._4_4_]];
  }
  this_state = pcVar2;
  last_state = pcVar2;
  first_state = pcVar2;
  nstates = 1;
  return;
}

Assistant:

void initialize_states()
{
    register int i;
    register Yshort *start_derives;
    register core *p;

    start_derives = derives[start_symbol];
    for (i = 0; start_derives[i] >= 0; ++i)
	continue;

    p = (core *) MALLOC(sizeof(core) + i*sizeof(Yshort));
    if (p == 0) no_space();

    p->next = 0;
    p->link = 0;
    p->number = 0;
    p->accessing_symbol = 0;
    p->nitems = i;

    for (i = 0;  start_derives[i] >= 0; ++i)
	p->items[i] = rrhs[start_derives[i]];

    first_state = last_state = this_state = p;
    nstates = 1;
}